

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

int __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  iVar4 = 0;
  if (pbVar3 < pbVar1) {
    iVar4 = (int)pbVar1 - (int)pbVar3;
    iVar2 = 0;
    do {
      if ((""[(ulong)*pbVar3 + 1] & 1U) == 0) {
        return iVar2;
      }
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
      iVar2 = iVar2 + 1;
    } while (pbVar3 != pbVar1);
  }
  return iVar4;
}

Assistant:

int WastLexer::ReadReservedChars() {
  int count = 0;
  while (IsReserved(PeekChar())) {
    ReadChar();
    ++count;
  }
  return count;
}